

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

void Vec_WrdReverseOrder(Vec_Wrd_t *p)

{
  word *pwVar1;
  word wVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = p->nSize;
  iVar3 = iVar4 / 2;
  for (lVar5 = 0; iVar4 = iVar4 + -1, lVar5 < iVar3; lVar5 = lVar5 + 1) {
    pwVar1 = p->pArray;
    wVar2 = pwVar1[lVar5];
    pwVar1[lVar5] = pwVar1[iVar4];
    pwVar1[iVar4] = wVar2;
  }
  return;
}

Assistant:

static inline void Vec_WrdReverseOrder( Vec_Wrd_t * p )
{
    word Temp;
    int i;
    for ( i = 0; i < p->nSize/2; i++ )
    {
        Temp = p->pArray[i];
        p->pArray[i] = p->pArray[p->nSize-1-i];
        p->pArray[p->nSize-1-i] = Temp;
    }
}